

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nC++17 introduced Hexadecimal Floating Point Literals ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"in three different formats.\n\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\"0x|0x hex-digit-seq\":\t\t\t\t",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x1ffp96:\t\t",0xb);
  poVar1 = std::ostream::_M_insert<double>(4.0485591044789077e+31);
  uStack_18._0_5_ = CONCAT14(10,(undefined4)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 4),1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\"0x|0x hex-digit-seq . \":\t\t\t",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0xa.p-2:\t\t",10);
  poVar1 = std::ostream::_M_insert<double>(2.5);
  uStack_18._0_6_ = CONCAT15(10,(undefined5)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 5),1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\"0x|0X hex-digit-seq . hex-digit-seq\":\t\t",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0x1.743p-3:\t\t",0xd);
  poVar1 = std::ostream::_M_insert<double>(0.181732177734375);
  uStack_18._0_7_ = CONCAT16(10,(undefined6)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 6),1);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
	std::cout << "\nC++17 introduced Hexadecimal Floating Point Literals "
			<<"in three different formats.\n\n" 
			<<"\"0x|0x hex-digit-seq\":\t\t\t\t" << "0x1ffp96:\t\t" << 0x1ffp96 << '\n'
			<<"\"0x|0x hex-digit-seq . \":\t\t\t" << "0xa.p-2:\t\t" << 0xa.p-2 << '\n'
			<<"\"0x|0X hex-digit-seq . hex-digit-seq\":\t\t" << "0x1.743p-3:\t\t" << 0x1.743p-3 << '\n'
		<< '\n' << std::endl;
}